

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::LoadConstantNDLayerParams::Clear(LoadConstantNDLayerParams *this)

{
  Arena *pAVar1;
  LoadConstantNDLayerParams *this_local;
  
  google::protobuf::RepeatedField<unsigned_long>::Clear(&this->shape_);
  pAVar1 = GetArenaNoVirtual(this);
  if (((pAVar1 == (Arena *)0x0) && (this->data_ != (WeightParams *)0x0)) &&
     (this->data_ != (WeightParams *)0x0)) {
    (*(this->data_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->data_ = (WeightParams *)0x0;
  return;
}

Assistant:

void LoadConstantNDLayerParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.LoadConstantNDLayerParams)
  shape_.Clear();
  if (GetArenaNoVirtual() == NULL && data_ != NULL) {
    delete data_;
  }
  data_ = NULL;
}